

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O3

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GetFloatConst(ConstantManager *this,float val)

{
  IRContext *this_00;
  Type *type;
  Constant *pCVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  float local_5c;
  Type local_58;
  
  this_00 = this->ctx_;
  if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(this_00);
  }
  local_58.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.kind_ = kFloat;
  local_58._36_4_ = 0x20;
  local_58._vptr_Type = (_func_int **)&PTR__Type_009357c8;
  type = TypeManager::GetRegisteredType
                   ((this_00->type_mgr_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                    .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                    _M_head_impl,&local_58);
  local_58._vptr_Type = (_func_int **)&PTR__Type_00930d10;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_58.decorations_);
  local_58.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._vptr_Type = (_func_int **)0x0;
  local_58.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5c = val;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,(iterator)0x0,
             (uint *)&local_5c);
  pCVar1 = GetConstant(this,type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58);
  if (local_58._vptr_Type != (_func_int **)0x0) {
    operator_delete(local_58._vptr_Type,
                    (long)local_58.decorations_.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_58._vptr_Type);
  }
  return pCVar1;
}

Assistant:

const Constant* ConstantManager::GetFloatConst(float val) {
  Type* float_type = context()->get_type_mgr()->GetFloatType();
  utils::FloatProxy<float> v(val);
  const Constant* c = GetConstant(float_type, v.GetWords());
  return c;
}